

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<float,double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,float *t_lhs,float *c_lhs,double *c_rhs
          )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double dVar2;
  undefined8 *puVar3;
  bool bVar4;
  bool bVar5;
  Boxed_Value BVar6;
  double local_10;
  
  switch(t_oper) {
  case equals:
    bVar4 = (double)*c_lhs == *c_rhs;
    break;
  case less_than:
    bVar4 = *c_rhs == (double)*c_lhs;
    bVar5 = *c_rhs < (double)*c_lhs;
    goto LAB_002fae99;
  case greater_than:
    bVar4 = (double)*c_lhs == *c_rhs;
    bVar5 = (double)*c_lhs < *c_rhs;
LAB_002fae99:
    bVar4 = !bVar5 && !bVar4;
    goto LAB_002faed5;
  case less_than_equal:
    bVar4 = *c_rhs < (double)*c_lhs;
    goto LAB_002fae77;
  case greater_than_equal:
    bVar4 = (double)*c_lhs < *c_rhs;
LAB_002fae77:
    bVar4 = !bVar4;
    goto LAB_002faed5;
  case not_equal:
    bVar4 = (double)*c_lhs != *c_rhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      local_10 = (double)*c_lhs + *c_rhs;
      break;
    case quotient:
      local_10 = (double)*c_lhs / *c_rhs;
      break;
    case product:
      local_10 = (double)*c_lhs * *c_rhs;
      break;
    case difference:
      local_10 = (double)*c_lhs - *c_rhs;
      break;
    default:
      if (t_lhs == (float *)0x0) {
switchD_002fae41_caseD_7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__bad_cast_003ceb38;
        __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        dVar2 = *c_rhs;
        break;
      default:
        goto switchD_002fae41_caseD_7;
      case assign_product:
        dVar2 = (double)*t_lhs * *c_rhs;
        break;
      case assign_sum:
        dVar2 = (double)*t_lhs + *c_rhs;
        break;
      case assign_quotient:
        dVar2 = (double)*t_lhs / *c_rhs;
        break;
      case assign_difference:
        dVar2 = (double)*t_lhs - *c_rhs;
      }
      *t_lhs = (float)dVar2;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      goto LAB_002faeda;
    }
    BVar6 = detail::const_var_impl<double>((detail *)this,&local_10);
    t_bv = BVar6.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    goto LAB_002faeda;
  }
  bVar4 = (bool)(-bVar4 & 1);
LAB_002faed5:
  BVar6 = const_var((chaiscript *)this,bVar4);
  t_bv = BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
LAB_002faeda:
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }